

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

void qpdf_oh_append_item(qpdf_data qpdf,qpdf_oh oh,qpdf_oh item)

{
  anon_class_16_2_3fbaaceb local_48;
  function<void_(QPDFObjectHandle_&)> local_38;
  qpdf_oh local_18;
  qpdf_oh local_14;
  qpdf_oh item_local;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  local_48.qpdf = qpdf;
  local_48.item = item;
  local_18 = item;
  local_14 = oh;
  _item_local = qpdf;
  std::function<void(QPDFObjectHandle&)>::function<qpdf_oh_append_item::__0,void>
            ((function<void(QPDFObjectHandle&)> *)&local_38,&local_48);
  do_with_oh_void(qpdf,oh,&local_38);
  std::function<void_(QPDFObjectHandle_&)>::~function(&local_38);
  return;
}

Assistant:

void
qpdf_oh_append_item(qpdf_data qpdf, qpdf_oh oh, qpdf_oh item)
{
    do_with_oh_void(qpdf, oh, [qpdf, item](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_append_item");
        o.appendItem(qpdf_oh_item_internal(qpdf, item));
    });
}